

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O2

void av1_get_block_dimensions
               (BLOCK_SIZE bsize,int plane,MACROBLOCKD *xd,int *width,int *height,
               int *rows_within_bounds,int *cols_within_bounds)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  undefined7 in_register_00000039;
  
  uVar6 = CONCAT71(in_register_00000039,bsize) & 0xffffffff;
  bVar1 = block_size_high[uVar6];
  bVar2 = block_size_wide[uVar6];
  iVar4 = *(int *)(CONCAT44(in_register_00000034,plane) + 0x1f00);
  iVar5 = *(int *)(CONCAT44(in_register_00000034,plane) + 0x1ef8);
  bVar3 = *(byte *)(CONCAT44(in_register_00000034,plane) + 0x18);
  if (xd != (MACROBLOCKD *)0x0) {
    xd->mi_row = (uint)(bVar2 >> (*(byte *)(CONCAT44(in_register_00000034,plane) + 0x14) & 0x1f));
  }
  if (width != (int *)0x0) {
    *width = (uint)(bVar1 >> (bVar3 & 0x1f));
  }
  if (height != (int *)0x0) {
    *height = (int)((iVar4 >> 0x1f & iVar4 >> 3) + (uint)bVar1) >>
              (*(byte *)(CONCAT44(in_register_00000034,plane) + 0x18) & 0x1f);
  }
  if (rows_within_bounds != (int *)0x0) {
    *rows_within_bounds =
         (int)((iVar5 >> 0x1f & iVar5 >> 3) + (uint)bVar2) >>
         (*(byte *)(CONCAT44(in_register_00000034,plane) + 0x14) & 0x1f);
  }
  return;
}

Assistant:

static inline void av1_get_block_dimensions(BLOCK_SIZE bsize, int plane,
                                            const MACROBLOCKD *xd, int *width,
                                            int *height,
                                            int *rows_within_bounds,
                                            int *cols_within_bounds) {
  const int block_height = block_size_high[bsize];
  const int block_width = block_size_wide[bsize];
  const int block_rows = (xd->mb_to_bottom_edge >= 0)
                             ? block_height
                             : (xd->mb_to_bottom_edge >> 3) + block_height;
  const int block_cols = (xd->mb_to_right_edge >= 0)
                             ? block_width
                             : (xd->mb_to_right_edge >> 3) + block_width;
  const struct macroblockd_plane *const pd = &xd->plane[plane];
  assert(IMPLIES(plane == PLANE_TYPE_Y, pd->subsampling_x == 0));
  assert(IMPLIES(plane == PLANE_TYPE_Y, pd->subsampling_y == 0));
  assert(block_width >= block_cols);
  assert(block_height >= block_rows);
  const int plane_block_width = block_width >> pd->subsampling_x;
  const int plane_block_height = block_height >> pd->subsampling_y;
  // Special handling for chroma sub8x8.
  const int is_chroma_sub8_x = plane > 0 && plane_block_width < 4;
  const int is_chroma_sub8_y = plane > 0 && plane_block_height < 4;
  if (width) {
    *width = plane_block_width + 2 * is_chroma_sub8_x;
    assert(*width >= 0);
  }
  if (height) {
    *height = plane_block_height + 2 * is_chroma_sub8_y;
    assert(*height >= 0);
  }
  if (rows_within_bounds) {
    *rows_within_bounds =
        (block_rows >> pd->subsampling_y) + 2 * is_chroma_sub8_y;
    assert(*rows_within_bounds >= 0);
  }
  if (cols_within_bounds) {
    *cols_within_bounds =
        (block_cols >> pd->subsampling_x) + 2 * is_chroma_sub8_x;
    assert(*cols_within_bounds >= 0);
  }
}